

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

void __thiscall
StringifyTest_FilterBranches_Test::~StringifyTest_FilterBranches_Test
          (StringifyTest_FilterBranches_Test *this)

{
  StringifyTest_FilterBranches_Test *this_local;
  
  ~StringifyTest_FilterBranches_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(StringifyTest, FilterBranches) {
  static auto branchesModuleText = R"wasm(
  (module
    (func $a
      (block $top
        (br $top)
      )
    )
    (func $b
      (block $top
        (br $top)
      )
    )
   )
  )wasm";
  Module wasm;
  parseWast(wasm, branchesModuleText);
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(&wasm);
  auto substrings = StringifyProcessor::repeatSubstrings(stringify.hashString);
  auto result = StringifyProcessor::filterBranches(substrings, stringify.exprs);

  EXPECT_EQ(result, (std::vector<SuffixTree::RepeatedSubstring>{}));
}